

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# random_generators.cpp
# Opt level: O2

Vector3d *
opengv::generateRandomTranslation(Vector3d *__return_storage_ptr__,double maximumParallax)

{
  uint uVar1;
  int iVar2;
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  Vector3d translation;
  double local_58;
  double dStack_50;
  double local_48;
  DenseBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
  local_40 [16];
  double local_30;
  double *local_28;
  
  uVar1 = rand();
  iVar2 = rand();
  auVar4 = vpinsrd_avx(ZEXT416(uVar1),iVar2,1);
  auVar4 = vcvtdq2pd_avx(auVar4);
  auVar3._8_8_ = 0x41dfffffffc00000;
  auVar3._0_8_ = 0x41dfffffffc00000;
  auVar3 = vdivpd_avx512vl(auVar4,auVar3);
  auVar4._8_8_ = 0xbfe0000000000000;
  auVar4._0_8_ = 0xbfe0000000000000;
  auVar4 = vaddpd_avx512vl(auVar3,auVar4);
  local_58 = auVar4._0_8_ + auVar4._0_8_;
  dStack_50 = auVar4._8_8_ + auVar4._8_8_;
  iVar2 = rand();
  local_48 = (double)iVar2 / 2147483647.0 + -0.5;
  local_48 = local_48 + local_48;
  local_30 = maximumParallax;
  local_28 = &local_58;
  Eigen::PlainObjectBase<Eigen::Matrix<double,3,1,0,3,1>>::
  _set_noalias<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,3,1,0,3,1>const>const,Eigen::Matrix<double,3,1,0,3,1>const>>
            ((PlainObjectBase<Eigen::Matrix<double,3,1,0,3,1>> *)__return_storage_ptr__,local_40);
  return __return_storage_ptr__;
}

Assistant:

Eigen::Vector3d
opengv::generateRandomTranslation( double maximumParallax )
{
  Eigen::Vector3d translation;
  translation[0] = (((double) rand())/ ((double) RAND_MAX)-0.5)*2.0;
  translation[1] = (((double) rand())/ ((double) RAND_MAX)-0.5)*2.0;
  translation[2] = (((double) rand())/ ((double) RAND_MAX)-0.5)*2.0;
  return maximumParallax * translation;
}